

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O3

void __thiscall
wasm::JSPI::makeWrapperForImport
          (JSPI *this,Function *im,Module *module,Name suspender,bool wasmSplit)

{
  undefined8 *puVar1;
  size_t *psVar2;
  ulong uVar3;
  char *pcVar4;
  uintptr_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  __uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> _Var11;
  Global *pGVar12;
  _Head_base<0UL,_wasm::Function_*,_false> this_00;
  Index IVar13;
  Module *__s;
  undefined8 *puVar14;
  Function *__s_00;
  Expression *pEVar15;
  Type *pTVar16;
  Type *__args;
  Block *this_01;
  LocalSet *pLVar17;
  GlobalSet *this_02;
  Global *pGVar18;
  MixedArena *this_03;
  ulong uVar19;
  Type type;
  undefined3 in_register_00000089;
  int iVar20;
  ExpressionList *this_04;
  string_view s;
  optional<wasm::Type> type_;
  string_view sVar21;
  Name NVar22;
  Signature SVar23;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_110;
  Type local_108;
  HeapType *local_100;
  Type *local_f8;
  ulong local_f0;
  undefined4 local_e4;
  char *local_e0;
  size_t local_d8;
  Expression *local_d0;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_c8;
  _Head_base<0UL,_wasm::Function_*,_false> local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  Iterator __begin2;
  Index local_7c;
  undefined1 auStack_78 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Builder local_40;
  Builder builder;
  
  local_e4 = CONCAT31(in_register_00000089,wasmSplit);
  local_e0 = suspender.super_IString.str._M_str;
  local_d8 = suspender.super_IString.str._M_len;
  local_40.wasm = module;
  __s = (Module *)operator_new(0x1d8);
  memset(__s,0,0x1d8);
  HeapType::HeapType((HeapType *)
                     &(__s->globals).
                      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(Signature)ZEXT816(0));
  *(undefined4 *)
   &(__s->globals).
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  (__s->tags).
  super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__s->tags).
  super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__s->tags).
  super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__s->elementSegments).
  super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__s->elementSegments).
  super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)&(__s->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  (__s->elementSegments).
  super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  (__s->memories).
  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__s->memories).
  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined4 *)
   &(__s->memories).
    super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0x3f800000;
  (__s->dataSegments).
  super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__s->dataSegments).
  super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__s->dataSegments).
  super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__s->customSections;
  (__s->tables).
  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  (__s->tables).
  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__s->tables).
  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)&(__s->start).super_IString.str._M_len = 0x3f800000;
  (__s->start).super_IString.str._M_str = (char *)0x0;
  (__s->customSections).
  super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__s->customSections).
  super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&__s->debugInfoSymbolNames;
  (__s->customSections).
  super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  (__s->dylinkSection)._M_t.
  super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
  super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
  super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl = (DylinkSection *)0x0;
  (__s->debugInfoFileNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined4 *)
   &(__s->debugInfoFileNames).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = 0x3f800000;
  (__s->debugInfoFileNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__s->debugInfoSymbolNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined1 *)((long)&(__s->debugInfoSourceRoot)._M_dataplus._M_p + 4) = 0;
  (__s->debugInfoSourceRoot).field_2._M_local_buf[0xc] = '\0';
  (__s->debugInfoFile)._M_dataplus._M_p =
       (pointer)&(__s->debugInfoSourcesContent).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__s->debugInfoFile)._M_string_length = 1;
  (__s->debugInfoFile).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__s->debugInfoFile).field_2 + 8) = 0;
  *(undefined4 *)
   &(__s->debugInfoSourcesContent).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0x3f800000;
  (__s->debugInfoSourcesContent).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__s->debugInfoSourcesContent).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(size_type **)&__s->features = &(__s->typeNames)._M_h._M_element_count;
  (__s->name).super_IString.str._M_len = 1;
  (__s->name).super_IString.str._M_str = (char *)0x0;
  (__s->typeNames)._M_h._M_buckets = (__buckets_ptr)0x0;
  *(undefined4 *)&(__s->typeNames)._M_h._M_bucket_count = 0x3f800000;
  *(undefined8 *)((long)&(__s->typeNames)._M_h._M_element_count + 4) = 0;
  *(undefined8 *)&(__s->typeNames)._M_h._M_rehash_policy.field_0x4 = 0;
  (__s->typeNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__s->typeNames)._M_h._M_element_count = 0;
  (__s->typeNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__s->typeIndices)._M_h._M_buckets = (__buckets_ptr)0x0;
  *(undefined2 *)&(__s->typeIndices)._M_h._M_bucket_count = 0;
  psVar2 = &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  local_a0 = (undefined1  [8])psVar2;
  builder.wasm = __s;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"import$","");
  pcVar4 = (im->super_Importable).super_Named.name.super_IString.str._M_str;
  local_c0._M_head_impl = (Function *)local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,pcVar4,
             pcVar4 + (im->super_Importable).super_Named.name.super_IString.str._M_len);
  uVar3 = (long)&(__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                 parent)->id + local_b8;
  uVar19 = 0xf;
  if (local_a0 != (undefined1  [8])psVar2) {
    uVar19 = __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  }
  if (uVar19 < uVar3) {
    uVar19 = 0xf;
    if (local_c0._M_head_impl != (Function *)local_b0) {
      uVar19 = local_b0._0_8_;
    }
    if (uVar3 <= uVar19) {
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
      type.id = (uintptr_t)
                __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
      goto LAB_00918c09;
    }
  }
  puVar14 = (undefined8 *)std::__cxx11::string::_M_append(local_a0,(ulong)local_c0._M_head_impl);
  type.id = (uintptr_t)
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
LAB_00918c09:
  auStack_78 = (undefined1  [8])
               &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish;
  puVar1 = puVar14 + 2;
  if ((pointer *)*puVar14 == (pointer *)puVar1) {
    params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*puVar1;
    params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)puVar14[3];
  }
  else {
    params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*puVar1;
    auStack_78 = (undefined1  [8])*puVar14;
  }
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)puVar14[1];
  *puVar14 = puVar1;
  puVar14[1] = 0;
  *(undefined1 *)puVar1 = 0;
  sVar21._M_str = (char *)0x0;
  sVar21._M_len = (size_t)auStack_78;
  sVar21 = IString::interned((IString *)
                             params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                             _M_impl.super__Vector_impl_data._M_start,sVar21,SUB81(puVar1,0));
  NVar22 = Names::getValidFunctionName(module,(Name)sVar21);
  *(IString *)
   &((builder.wasm)->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data = NVar22.super_IString.str;
  if (auStack_78 !=
      (undefined1  [8])
      &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_78,
                    (ulong)((long)&(params.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->id + 1));
  }
  if (local_c0._M_head_impl != (Function *)local_b0) {
    operator_delete(local_c0._M_head_impl,local_b0._0_8_ + 1);
  }
  if (local_a0 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_a0,
                    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index + 1);
  }
  puVar8 = (pointer)(im->super_Importable).module.super_IString.str._M_str;
  ((builder.wasm)->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(im->super_Importable).module.super_IString.str._M_len;
  ((builder.wasm)->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar8;
  puVar9 = (pointer)(im->super_Importable).base.super_IString.str._M_str;
  ((builder.wasm)->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(im->super_Importable).base.super_IString.str._M_len;
  ((builder.wasm)->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar9;
  __s_00 = (Function *)operator_new(0x1d8);
  memset(__s_00,0,0x1d8);
  HeapType::HeapType(&__s_00->type,(Signature)ZEXT816(0));
  __s_00->profile = Normal;
  (__s_00->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__s_00->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__s_00->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s_00->body = (Expression *)0x0;
  (__s_00->localNames)._M_h._M_buckets = &(__s_00->localNames)._M_h._M_single_bucket;
  (__s_00->localNames)._M_h._M_bucket_count = 1;
  (__s_00->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__s_00->localNames)._M_h._M_element_count = 0;
  (__s_00->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__s_00->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (__s_00->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__s_00->localIndices)._M_h._M_buckets = &(__s_00->localIndices)._M_h._M_single_bucket;
  (__s_00->localIndices)._M_h._M_bucket_count = 1;
  (__s_00->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__s_00->localIndices)._M_h._M_element_count = 0;
  (__s_00->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__s_00->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  (__s_00->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__s_00->debugLocations)._M_h._M_buckets = &(__s_00->debugLocations)._M_h._M_single_bucket;
  (__s_00->debugLocations)._M_h._M_bucket_count = 1;
  (__s_00->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__s_00->debugLocations)._M_h._M_element_count = 0;
  (__s_00->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__s_00->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  (__s_00->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__s_00->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  (__s_00->epilogLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  (__s_00->expressionLocations)._M_h._M_buckets =
       &(__s_00->expressionLocations)._M_h._M_single_bucket;
  (__s_00->expressionLocations)._M_h._M_bucket_count = 1;
  (__s_00->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__s_00->expressionLocations)._M_h._M_element_count = 0;
  (__s_00->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__s_00->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  (__s_00->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__s_00->delimiterLocations)._M_h._M_buckets = &(__s_00->delimiterLocations)._M_h._M_single_bucket
  ;
  (__s_00->delimiterLocations)._M_h._M_bucket_count = 1;
  (__s_00->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__s_00->delimiterLocations)._M_h._M_element_count = 0;
  (__s_00->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)((long)&(__s_00->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
  (__s_00->funcLocation).declarations = 0;
  (__s_00->funcLocation).end = 0;
  (__s_00->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  (__s_00->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__s_00->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__s_00->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __s_00->noFullInline = false;
  __s_00->noPartialInline = false;
  s._M_str = (char *)0x0;
  s._M_len = (size_t)(im->super_Importable).super_Named.name.super_IString.str._M_str;
  local_c0._M_head_impl = __s_00;
  sVar21 = IString::interned((IString *)
                             (im->super_Importable).super_Named.name.super_IString.str._M_len,s,
                             false);
  ((local_c0._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar21;
  ((local_c0._M_head_impl)->type).id = (im->type).id;
  local_d0 = (Expression *)MixedArena::allocSpace(&module->allocator,0x48,8);
  local_d0->_id = CallId;
  (local_d0->type).id = 0;
  *(undefined8 *)(local_d0 + 1) = 0;
  local_d0[1].type.id = 0;
  *(undefined8 *)(local_d0 + 2) = 0;
  local_d0[2].type.id = (uintptr_t)&module->allocator;
  *(undefined8 *)(local_d0 + 3) = 0;
  local_d0[3].type.id = 0;
  local_d0[4]._id = InvalidId;
  puVar10 = ((builder.wasm)->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(local_d0 + 3) =
       ((builder.wasm)->exports).
       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d0[3].type.id = (uintptr_t)puVar10;
  auStack_78 = (undefined1  [8])0x0;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_f8 = &this->externref;
  std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
            ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_78,(iterator)0x0,local_f8);
  uVar5 = local_f8->id;
  pEVar15 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
  local_c8 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(local_d0 + 1);
  pEVar15->_id = GlobalGetId;
  *(size_t *)(pEVar15 + 1) = local_d8;
  pEVar15[1].type.id = (uintptr_t)local_e0;
  (pEVar15->type).id = uVar5;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back(local_c8,pEVar15);
  SVar23 = HeapType::getSignature(&im->type);
  local_110._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
       SVar23.params.id;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_100 = &im->type;
  local_a0 = (undefined1  [8])&local_110;
  pTVar16 = (Type *)wasm::Type::size((Type *)&local_110);
  if ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
       pTVar16) || (local_a0 != (undefined1  [8])&local_110)) {
    iVar20 = 0;
    do {
      __args = wasm::Type::Iterator::operator*((Iterator *)local_a0);
      uVar5 = __args->id;
      pEVar15 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      pEVar15->_id = LocalGetId;
      *(int *)(pEVar15 + 1) = iVar20;
      (pEVar15->type).id = uVar5;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (local_c8,pEVar15);
      if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_78,
                   (iterator)
                   params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start,__args);
      }
      else {
        (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = __args->id;
        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      iVar20 = iVar20 + 1;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
              pTVar16) || (local_a0 != (undefined1  [8])&local_110));
  }
  this_03 = &(local_40.wasm)->allocator;
  this_01 = (Block *)MixedArena::allocSpace(this_03,0x40,8);
  pTVar16 = local_f8;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (this_01->name).super_IString.str._M_len = 0;
  (this_01->name).super_IString.str._M_str = (char *)0x0;
  (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (this_01->list).allocator = this_03;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_f8->id;
  IVar13 = Builder::addVar((Builder *)local_c0._M_head_impl,(Function *)0x0,(Name)(auVar6 << 0x40),
                           type);
  local_c8 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             CONCAT44(local_c8._4_4_,IVar13);
  SVar23 = HeapType::getSignature(&(local_c0._M_head_impl)->type);
  this_00._M_head_impl = local_c0._M_head_impl;
  local_f0 = (ulong)SVar23.results.id;
  if (1 < local_f0) {
    SVar23 = HeapType::getSignature(&(local_c0._M_head_impl)->type);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = SVar23.results.id.id;
    local_7c = Builder::addVar((Builder *)this_00._M_head_impl,(Function *)0x0,
                               (Name)(auVar7 << 0x40),type);
  }
  uVar5 = pTVar16->id;
  pEVar15 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
  pEVar15->_id = GlobalGetId;
  *(size_t *)(pEVar15 + 1) = local_d8;
  pEVar15[1].type.id = (uintptr_t)local_e0;
  (pEVar15->type).id = uVar5;
  pLVar17 = Builder::makeLocalSet(&local_40,(Index)local_c8,pEVar15);
  this_04 = &this_01->list;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_04->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)pLVar17);
  if (local_f0 < 2) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_04->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               local_d0);
  }
  else {
    pLVar17 = Builder::makeLocalSet(&local_40,local_7c,local_d0);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_04->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pLVar17);
  }
  uVar5 = pTVar16->id;
  pEVar15 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
  pEVar15->_id = LocalGetId;
  *(Index *)(pEVar15 + 1) = (Index)local_c8;
  (pEVar15->type).id = uVar5;
  this_02 = (GlobalSet *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = GlobalSetId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
  (this_02->name).super_IString.str._M_len = local_d8;
  (this_02->name).super_IString.str._M_str = local_e0;
  this_02->value = pEVar15;
  GlobalSet::finalize(this_02);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_04->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)this_02);
  if (1 < local_f0) {
    SVar23 = HeapType::getSignature(&(local_c0._M_head_impl)->type);
    this_02 = (GlobalSet *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    (this_02->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = LocalGetId;
    *(Index *)&(this_02->name).super_IString.str._M_len = local_7c;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id =
         SVar23.results.id.id;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_04->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)this_02);
  }
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)this_02;
  Block::finalize(this_01,type_,Unknown);
  SVar23 = HeapType::getSignature(local_100);
  pTVar16 = &local_d0->type;
  pTVar16->id = SVar23.results.id.id;
  (local_c0._M_head_impl)->body = (Expression *)this_01;
  wasm::Type::Type(&local_108,(Tuple *)auStack_78);
  SVar23.results.id = pTVar16->id;
  SVar23.params.id = local_108.id;
  HeapType::HeapType((HeapType *)local_a0,SVar23);
  ((builder.wasm)->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_a0;
  pGVar12 = DAT_010b1d20;
  _Var11._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
       (tuple<wasm::Global_*,_std::default_delete<wasm::Global>_>)
       (tuple<wasm::Global_*,_std::default_delete<wasm::Global>_>)
       ModuleSplitting::LOAD_SECONDARY_MODULE._M_head_impl;
  pGVar18 = (Global *)(im->super_Importable).super_Named.name.super_IString.str._M_str;
  if (((char)local_e4 != '\0') && (pGVar18 == DAT_010b1d20)) {
    local_a0 = (undefined1  [8])operator_new(0x30);
    pGVar18 = DAT_010b1d20;
    (((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)((long)local_a0 + 0x18))->_M_t
    ).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
         ModuleSplitting::LOAD_SECONDARY_MODULE._M_head_impl;
    (((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)((long)local_a0 + 0x20))->_M_t
    ).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = pGVar18;
    *(tuple<wasm::Global_*,_std::default_delete<wasm::Global>_> *)local_a0 =
         _Var11._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    (((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)((long)local_a0 + 8))->_M_t).
    super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = pGVar12;
    *(undefined4 *)
     &(((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)((long)local_a0 + 0x10))->
      _M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = 0;
    *(undefined1 *)
     &(((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)((long)local_a0 + 0x28))->
      _M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = 0;
    Module::addExport(module,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                             local_a0);
    if ((__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)local_a0 !=
        (__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)0x0) {
      operator_delete((void *)local_a0,0x30);
    }
    pGVar18 = (Global *)(im->super_Importable).super_Named.name.super_IString.str._M_str;
  }
  NVar22.super_IString.str._M_str = (char *)pGVar18;
  NVar22.super_IString.str._M_len = (im->super_Importable).super_Named.name.super_IString.str._M_len
  ;
  Module::removeFunction(module,NVar22);
  Module::addFunction(module,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                             &local_c0);
  Module::addFunction(module,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                             &builder);
  if (auStack_78 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_78,
                    (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)auStack_78);
  }
  if (local_c0._M_head_impl != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_c0,local_c0._M_head_impl);
  }
  if (builder.wasm != (Module *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&builder,(Function *)builder.wasm);
  }
  return;
}

Assistant:

void makeWrapperForImport(Function* im,
                            Module* module,
                            Name suspender,
                            bool wasmSplit) {
    Builder builder(*module);
    auto wrapperIm = std::make_unique<Function>();
    wrapperIm->name = Names::getValidFunctionName(
      *module, std::string("import$") + im->name.toString());
    wrapperIm->module = im->module;
    wrapperIm->base = im->base;
    auto stub = std::make_unique<Function>();
    stub->name = Name(im->name.str);
    stub->type = im->type;

    auto* call = module->allocator.alloc<Call>();
    call->target = wrapperIm->name;

    // Add an externref as the first argument to the imported function.
    std::vector<Type> params;
    params.push_back(externref);
    call->operands.push_back(builder.makeGlobalGet(suspender, externref));
    Index i = 0;
    for (const auto& param : im->getParams()) {
      call->operands.push_back(builder.makeLocalGet(i, param));
      params.push_back(param);
      ++i;
    }
    auto* block = builder.makeBlock();
    // Store the suspender so it can be restored after the call in case it is
    // modified by another entry into a Wasm export.
    auto supsenderCopyIndex = Builder::addVar(stub.get(), externref);
    // If there's a return value we need to store it so it can be returned
    // after restoring the suspender.
    std::optional<Index> returnIndex;
    if (stub->getResults().isConcrete()) {
      returnIndex = Builder::addVar(stub.get(), stub->getResults());
    }
    block->list.push_back(builder.makeLocalSet(
      supsenderCopyIndex, builder.makeGlobalGet(suspender, externref)));
    if (returnIndex) {
      block->list.push_back(builder.makeLocalSet(*returnIndex, call));
    } else {
      block->list.push_back(call);
    }
    // Restore the suspender.
    block->list.push_back(builder.makeGlobalSet(
      suspender, builder.makeLocalGet(supsenderCopyIndex, externref)));
    if (returnIndex) {
      block->list.push_back(
        builder.makeLocalGet(*returnIndex, stub->getResults()));
    }
    block->finalize();
    call->type = im->getResults();
    stub->body = block;
    wrapperIm->type = Signature(Type(params), call->type);

    if (wasmSplit && im->name == ModuleSplitting::LOAD_SECONDARY_MODULE) {
      // In non-debug builds the name of the JSPI wrapper function for loading
      // the secondary module will be removed. Create an export of it so that
      // wasm-split can find it.
      module->addExport(
        builder.makeExport(ModuleSplitting::LOAD_SECONDARY_MODULE,
                           ModuleSplitting::LOAD_SECONDARY_MODULE,
                           ExternalKind::Function));
    }
    module->removeFunction(im->name);
    module->addFunction(std::move(stub));
    module->addFunction(std::move(wrapperIm));
  }